

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetAttributes
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,PropertyAttributes attributes)

{
  BOOL BVar1;
  ES5Array *arr;
  uint32 local_34;
  ScriptContext *pSStack_30;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyAttributes attributes_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  scriptContext._3_1_ = attributes;
  scriptContext._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSStack_30 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_30,scriptContext._4_4_,&local_34);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DictionaryTypeHandlerBase<unsigned_short>::SetAttributes
                   (&this->super_DictionaryTypeHandlerBase<unsigned_short>,pDStack_20,
                    scriptContext._4_4_,scriptContext._3_1_);
  }
  else {
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(pDStack_20);
    this_local._4_4_ = SetItemAttributes(this,arr,pDStack_20,local_34,scriptContext._3_1_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return SetItemAttributes(VarTo<ES5Array>(instance), instance, index, attributes);
        }

        return __super::SetAttributes(instance, propertyId, attributes);
    }